

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O0

void __thiscall
Assimp::B3DImporter::InternReadFile
          (B3DImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  int iVar1;
  IOStream *__p;
  pointer pIVar2;
  DeadlyImportError *pDVar3;
  undefined4 extraout_var;
  reference pvVar4;
  allocator<char> local_d9;
  string local_d8;
  ulong local_b8;
  size_t fileSize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator<char> local_51;
  string local_50;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_30;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> file;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  B3DImporter *this_local;
  
  file._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       pIOHandler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"rb",&local_51);
  __p = IOSystem::Open(pIOHandler,pFile,&local_50);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_30,__p);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  pIVar2 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_30)
  ;
  if (pIVar2 == (pointer)0x0) {
    fileSize._7_1_ = 1;
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_a8,"Failed to open B3D file ",pFile);
    std::operator+(&local_88,&local_a8,".");
    DeadlyImportError::DeadlyImportError(pDVar3,&local_88);
    fileSize._7_1_ = 0;
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  pIVar2 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                     (&local_30);
  iVar1 = (*pIVar2->_vptr_IOStream[6])();
  local_b8 = CONCAT44(extraout_var,iVar1);
  if (local_b8 < 8) {
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"B3D File is too small.",&local_d9);
    DeadlyImportError::DeadlyImportError(pDVar3,&local_d8);
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  this->_pos = 0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->_buf,local_b8);
  pIVar2 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::operator->
                     (&local_30);
  pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&this->_buf,0);
  (*pIVar2->_vptr_IOStream[2])(pIVar2,pvVar4,1,local_b8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->_stack);
  ReadBB3D(this,pScene);
  std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::~unique_ptr(&local_30);
  return;
}

Assistant:

void B3DImporter::InternReadFile( const std::string& pFile, aiScene* pScene, IOSystem* pIOHandler){
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile));

    // Check whether we can read from the file
    if( file.get() == nullptr) {
        throw DeadlyImportError( "Failed to open B3D file " + pFile + ".");
    }

    // check whether the .b3d file is large enough to contain
    // at least one chunk.
    size_t fileSize = file->FileSize();
    if( fileSize<8 ) {
        throw DeadlyImportError( "B3D File is too small.");
    }

    _pos=0;
    _buf.resize( fileSize );
    file->Read( &_buf[0],1,fileSize );
    _stack.clear();

    ReadBB3D( pScene );
}